

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.hpp
# Opt level: O0

GMXPGRP * __thiscall GMXMDP::GMXPGRP::operator=(GMXPGRP *this,GMXPGRP *src)

{
  bool bVar1;
  reference __args;
  FunctVV *rstfunct;
  const_iterator __end1;
  const_iterator __begin1;
  vFunctVV *__range1;
  GMXPGRP *src_local;
  GMXPGRP *this_local;
  
  this->gid = src->gid;
  std::__cxx11::string::operator=((string *)&this->gidstr,(string *)&src->gidstr);
  this->rstT = src->rstT;
  std::vector<double,_std::allocator<double>_>::operator=(&this->init,&src->init);
  std::vector<double,_std::allocator<double>_>::operator=(&this->initB,&src->initB);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vec,&src->vec);
  this->k = src->k;
  this->kB = src->kB;
  this->r0 = src->r0;
  this->r0B = src->r0B;
  this->r1 = src->r1;
  this->r1B = src->r1B;
  this->k0 = src->k0;
  this->k0B = src->k0B;
  this->k1 = src->k1;
  this->k1B = src->k1B;
  this->nc0 = src->nc0;
  this->nc0B = src->nc0B;
  std::vector<double,_std::allocator<double>_>::operator=(&this->Lrst,&src->Lrst);
  std::
  vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
  ::clear(&this->rstfuncts);
  __end1 = std::
           vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
           ::begin(&src->rstfuncts);
  rstfunct = (FunctVV *)
             std::
             vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
             ::end(&src->rstfuncts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_*,_std::vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>_>
                                *)&rstfunct);
    if (!bVar1) break;
    __args = __gnu_cxx::
             __normal_iterator<const_Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_*,_std::vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>_>
             ::operator*(&__end1);
    std::
    vector<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>,std::allocator<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>>>
    ::
    emplace_back<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>const&>
              ((vector<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>,std::allocator<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>>>
                *)&this->rstfuncts,__args);
    __gnu_cxx::
    __normal_iterator<const_Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_*,_std::vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

GMXPGRP& operator=(const GMXPGRP& src) {
    gid = src.gid;
    gidstr = src.gidstr;
    rstT = src.rstT;
    init = src.init;
    initB = src.initB;
    vec = src.vec;
    k = src.k;
    kB = src.kB;
    r0 = src.r0;
    r0B = src.r0B;
    r1 = src.r1;
    r1B = src.r1B;
    k0 = src.k0;
    k0B = src.k0B;
    k1 = src.k1;
    k1B = src.k1B;
    nc0 = src.nc0;
    nc0B = src.nc0B;
    Lrst = src.Lrst;

    rstfuncts.clear();
    for(const FunctVV& rstfunct: src.rstfuncts) {
      rstfuncts.emplace_back(rstfunct);
    }

    return *this;
  }